

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vscanf.c
# Opt level: O3

int main(void)

{
  int iVar1;
  FILE *pFVar2;
  FILE *pFVar3;
  size_t sVar4;
  int i;
  int n;
  uint u;
  char buffer [100];
  int local_ac;
  int local_a8;
  int local_a4;
  int *local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  pFVar2 = freopen("test_support/testfile","wb+",(FILE *)stdin);
  if (pFVar2 == (FILE *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/vscanf.c, line %d - %s\n"
           ,0x26,"( source = freopen( testfile, \"wb+\", stdin ) ) != NULL");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar2);
  fwrite("foo",1,3,pFVar3);
  pFVar2 = pFVar3;
  rewind(pFVar3);
  iVar1 = testscanf((FILE *)pFVar2,"%3c",&local_98);
  if (iVar1 != 1) {
    main_cold_1();
  }
  if (local_98._2_1_ != 'o' || (short)(int)local_98 != 0x6f66) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0xc,"memcmp( buffer, \"foo\", 3 ) == 0");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("%x",1,2,pFVar3);
  pFVar2 = pFVar3;
  rewind(pFVar3);
  iVar1 = testscanf((FILE *)pFVar2,"%%%c%n",&local_98,&local_a8);
  if (iVar1 != 1) {
    main_cold_2();
  }
  if (local_a8 != 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x10,"n == 2");
  }
  if ((char)local_98 != 'x') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x11,"buffer[0] == \'x\'");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("abcdefg",1,7,pFVar3);
  pFVar2 = pFVar3;
  rewind(pFVar3);
  iVar1 = testscanf((FILE *)pFVar2,"%*[cba]%n",&local_a8);
  if (iVar1 != 0) {
    main_cold_3();
  }
  if (local_a8 != 3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x14,"n == 3");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("foo",1,3,pFVar3);
  pFVar2 = pFVar3;
  rewind(pFVar3);
  iVar1 = testscanf((FILE *)pFVar2,"%*s%n",&local_a8);
  if (iVar1 != 0) {
    main_cold_4();
  }
  if (local_a8 != 3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x16,"n == 3");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("abc",1,3,pFVar3);
  pFVar2 = pFVar3;
  rewind(pFVar3);
  iVar1 = testscanf((FILE *)pFVar2,"%*c%n",&local_a8);
  if (iVar1 != 0) {
    main_cold_5();
  }
  if (local_a8 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x18,"n == 1");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("3xfoo",1,5,pFVar3);
  pFVar2 = pFVar3;
  rewind(pFVar3);
  iVar1 = testscanf((FILE *)pFVar2,"%*dx%3c",&local_98);
  if (iVar1 != 1) {
    main_cold_6();
  }
  if (local_98._2_1_ != 'o' || (short)(int)local_98 != 0x6f66) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x1a,"memcmp( buffer, \"foo\", 3 ) == 0");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("-2147483648",1,0xb,pFVar3);
  pFVar2 = pFVar3;
  rewind(pFVar3);
  iVar1 = testscanf((FILE *)pFVar2,"%d",&local_ac);
  if (iVar1 != 1) {
    main_cold_7();
  }
  TEST_RESULTS = TEST_RESULTS + 1;
  printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
         ,0x1e,"i == INT_MIN");
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("2147483647",1,10,pFVar3);
  pFVar2 = pFVar3;
  rewind(pFVar3);
  iVar1 = testscanf((FILE *)pFVar2,"%d",&local_ac);
  if (iVar1 != 1) {
    main_cold_8();
  }
  if (local_ac != 0x7fffffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x20,"i == INT_MAX");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("-1",1,2,pFVar3);
  pFVar2 = pFVar3;
  rewind(pFVar3);
  iVar1 = testscanf((FILE *)pFVar2,"%d",&local_ac);
  if (iVar1 != 1) {
    main_cold_9();
  }
  if (local_ac != -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x22,"i == -1");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fputc(0x30,pFVar3);
  pFVar2 = pFVar3;
  rewind(pFVar3);
  iVar1 = testscanf((FILE *)pFVar2,"%d",&local_ac);
  if (iVar1 != 1) {
    main_cold_10();
  }
  if (local_ac != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x24,"i == 0");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fputc(0x31,pFVar3);
  pFVar2 = pFVar3;
  rewind(pFVar3);
  iVar1 = testscanf((FILE *)pFVar2,"%d",&local_ac);
  if (iVar1 != 1) {
    main_cold_11();
  }
  if (local_ac != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x26,"i == 1");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("-2147483648",1,0xb,pFVar3);
  pFVar2 = pFVar3;
  rewind(pFVar3);
  iVar1 = testscanf((FILE *)pFVar2,"%i",&local_ac);
  if (iVar1 != 1) {
    main_cold_12();
  }
  TEST_RESULTS = TEST_RESULTS + 1;
  printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
         ,0x28,"i == INT_MIN");
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("2147483647",1,10,pFVar3);
  pFVar2 = pFVar3;
  rewind(pFVar3);
  iVar1 = testscanf((FILE *)pFVar2,"%i",&local_ac);
  if (iVar1 != 1) {
    main_cold_13();
  }
  if (local_ac != 0x7fffffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x2a,"i == INT_MAX");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("-1",1,2,pFVar3);
  pFVar2 = pFVar3;
  rewind(pFVar3);
  iVar1 = testscanf((FILE *)pFVar2,"%i",&local_ac);
  if (iVar1 != 1) {
    main_cold_14();
  }
  if (local_ac != -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x2c,"i == -1");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fputc(0x30,pFVar3);
  pFVar2 = pFVar3;
  rewind(pFVar3);
  iVar1 = testscanf((FILE *)pFVar2,"%i",&local_ac);
  if (iVar1 != 1) {
    main_cold_15();
  }
  if (local_ac != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x2e,"i == 0");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fputc(0x31,pFVar3);
  pFVar2 = pFVar3;
  rewind(pFVar3);
  iVar1 = testscanf((FILE *)pFVar2,"%i",&local_ac);
  if (iVar1 != 1) {
    main_cold_16();
  }
  if (local_ac != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x30,"i == 1");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("0x7FFFFFFF",1,10,pFVar3);
  pFVar2 = pFVar3;
  rewind(pFVar3);
  iVar1 = testscanf((FILE *)pFVar2,"%i",&local_ac);
  if (iVar1 != 1) {
    main_cold_17();
  }
  if (local_ac != 0x7fffffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x32,"i == INT_MAX");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("0x0",1,3,pFVar3);
  pFVar2 = pFVar3;
  rewind(pFVar3);
  iVar1 = testscanf((FILE *)pFVar2,"%i",&local_ac);
  if (iVar1 != 1) {
    main_cold_18();
  }
  if (local_ac != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x34,"i == 0");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("00",1,2,pFVar3);
  pFVar2 = pFVar3;
  rewind(pFVar3);
  iVar1 = testscanf((FILE *)pFVar2,"%i%n",&local_ac,&local_a8);
  if (iVar1 != 1) {
    main_cold_19();
  }
  if (local_ac != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x37,"i == 0");
  }
  if (local_a8 != 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x38,"n == 2");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("4294967295",1,10,pFVar3);
  pFVar2 = pFVar3;
  rewind(pFVar3);
  iVar1 = testscanf((FILE *)pFVar2,"%u",&local_a4);
  if (iVar1 != 1) {
    main_cold_20();
  }
  if (local_a4 != -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x3c,"u == UINT_MAX");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fputc(0x30,pFVar3);
  pFVar2 = pFVar3;
  rewind(pFVar3);
  iVar1 = testscanf((FILE *)pFVar2,"%u",&local_a4);
  if (iVar1 != 1) {
    main_cold_21();
  }
  if (local_a4 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x3e,"u == 0");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("fFFFFFFF",1,8,pFVar3);
  pFVar2 = pFVar3;
  rewind(pFVar3);
  iVar1 = testscanf((FILE *)pFVar2,"%x",&local_a4);
  if (iVar1 != 1) {
    main_cold_22();
  }
  if (local_a4 != -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x40,"u == UINT_MAX");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("7FFFFFFF",1,8,pFVar3);
  pFVar2 = pFVar3;
  rewind(pFVar3);
  iVar1 = testscanf((FILE *)pFVar2,"%x",&local_a4);
  if (iVar1 != 1) {
    main_cold_23();
  }
  if (local_a4 != 0x7fffffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x42,"u == INT_MAX");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fputc(0x30,pFVar3);
  pFVar2 = pFVar3;
  rewind(pFVar3);
  iVar1 = testscanf((FILE *)pFVar2,"%o",&local_a4);
  if (iVar1 != 1) {
    main_cold_24();
  }
  if (local_a4 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x44,"u == 0");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("37777777777",1,0xb,pFVar3);
  pFVar2 = pFVar3;
  rewind(pFVar3);
  iVar1 = testscanf((FILE *)pFVar2,"%o",&local_a4);
  if (iVar1 != 1) {
    main_cold_25();
  }
  if (local_a4 != -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x46,"u == UINT_MAX");
  }
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_38 = 0;
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fputc(0x78,pFVar3);
  pFVar2 = pFVar3;
  rewind(pFVar3);
  iVar1 = testscanf((FILE *)pFVar2,"%c",&local_98);
  if (iVar1 != 1) {
    main_cold_26();
  }
  if ((short)local_98 != 0x78) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x4a,"memcmp( buffer, \"x\\0\", 2 ) == 0");
  }
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_38 = 0;
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("foo bar",1,7,pFVar3);
  pFVar2 = pFVar3;
  rewind(pFVar3);
  iVar1 = testscanf((FILE *)pFVar2,"%s%n",&local_98,&local_a8);
  if (iVar1 != 1) {
    main_cold_27();
  }
  if ((int)local_98 != 0x6f6f66) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x4f,"memcmp( buffer, \"foo\\0\", 4 ) == 0");
  }
  if (local_a8 != 3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x50,"n == 3");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("foo bar  baz",1,0xc,pFVar3);
  pFVar2 = pFVar3;
  rewind(pFVar3);
  iVar1 = testscanf((FILE *)pFVar2,"%s %s %n",&local_98,(long)&local_98 + 4,&local_a8);
  if (iVar1 != 2) {
    main_cold_28();
  }
  if (local_a8 != 9) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x52,"n == 9");
  }
  if (local_98 != 0x726162006f6f66) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x53,"memcmp( buffer, \"foo\\0bar\\0\", 8 ) == 0");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("abcdefg",1,7,pFVar3);
  pFVar2 = pFVar3;
  rewind(pFVar3);
  iVar1 = testscanf((FILE *)pFVar2,"%[cba]",&local_98);
  if (iVar1 != 1) {
    main_cold_29();
  }
  if ((int)local_98 != 0x636261) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x57,"memcmp( buffer, \"abc\\0\", 4 ) == 0");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  pFVar2 = pFVar3;
  rewind(pFVar3);
  iVar1 = testscanf((FILE *)pFVar2,"%[cba]",&local_98);
  if (iVar1 != -1) {
    main_cold_30();
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fputc(0x33,pFVar3);
  pFVar2 = pFVar3;
  rewind(pFVar3);
  iVar1 = testscanf((FILE *)pFVar2,"%u%[cba]",&local_a4,&local_98);
  if (iVar1 != 1) {
    main_cold_31();
  }
  sprintf((char *)&local_98,"%p",0);
  local_a0 = &local_ac;
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  sVar4 = strlen((char *)&local_98);
  fwrite(&local_98,1,sVar4,pFVar3);
  pFVar2 = pFVar3;
  rewind(pFVar3);
  iVar1 = testscanf((FILE *)pFVar2,"%p",&local_a0);
  if (iVar1 != 1) {
    main_cold_32();
  }
  if (local_a0 != (int *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x61,"p == NULL");
  }
  local_a0 = &local_ac;
  sprintf((char *)&local_98,"%p",&local_ac);
  local_a0 = (int *)0x0;
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  sVar4 = strlen((char *)&local_98);
  fwrite(&local_98,1,sVar4,pFVar3);
  pFVar2 = pFVar3;
  rewind(pFVar3);
  iVar1 = testscanf((FILE *)pFVar2,"%p",&local_a0);
  if (iVar1 != 1) {
    main_cold_33();
  }
  if (local_a0 != &local_ac) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x66,"p == &i");
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  pFVar2 = pFVar3;
  rewind(pFVar3);
  iVar1 = testscanf((FILE *)pFVar2,"%d",&local_ac);
  if (iVar1 != -1) {
    main_cold_34();
  }
  pFVar3 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("foo",1,3,pFVar3);
  pFVar2 = pFVar3;
  rewind(pFVar3);
  iVar1 = testscanf((FILE *)pFVar2,"%5c",&local_98);
  if (iVar1 != 1) {
    main_cold_35();
  }
  if (local_98._2_1_ != 'o' || (short)local_98 != 0x6f66) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x6a,"memcmp( buffer, \"foo\", 3 ) == 0");
  }
  iVar1 = fclose(pFVar3);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/vscanf.c, line %d - %s\n"
           ,0x28,"fclose( source ) == 0");
  }
  iVar1 = remove("test_support/testfile");
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/vscanf.c, line %d - %s\n"
           ,0x29,"remove( testfile ) == 0");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    FILE * source;
    TESTCASE( ( source = freopen( testfile, "wb+", stdin ) ) != NULL );
#include "scanf_testcases.h"
    TESTCASE( fclose( source ) == 0 );
    TESTCASE( remove( testfile ) == 0 );
    return TEST_RESULTS;
}